

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtVector3.h
# Opt level: O3

int ClipSegmentToLine(ClipVertex *vOut,ClipVertex *vIn,cbtVector3 *normal,cbtScalar offset)

{
  float fVar1;
  ulong uVar2;
  float fVar3;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  int *piVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(normal->m_floats[1] * (vIn->v).m_floats[1])),
                            ZEXT416((uint)normal->m_floats[0]),ZEXT416((uint)(vIn->v).m_floats[0]));
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(normal->m_floats[1] * vIn[1].v.m_floats[1])),
                            ZEXT416((uint)normal->m_floats[0]),ZEXT416((uint)vIn[1].v.m_floats[0]));
  auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)normal->m_floats[2]),
                            ZEXT416((uint)(vIn->v).m_floats[2]));
  auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)normal->m_floats[2]),
                            ZEXT416((uint)vIn[1].v.m_floats[2]));
  fVar3 = auVar10._0_4_ - offset;
  fVar8 = auVar11._0_4_ - offset;
  if (fVar3 <= 0.0) {
    vOut->id = vIn->id;
    uVar4 = *(undefined8 *)((vIn->v).m_floats + 2);
    *(undefined8 *)(vOut->v).m_floats = *(undefined8 *)(vIn->v).m_floats;
    *(undefined8 *)((vOut->v).m_floats + 2) = uVar4;
  }
  uVar6 = (uint)(fVar3 <= 0.0);
  uVar5 = uVar6;
  if (fVar8 <= 0.0) {
    uVar5 = uVar6 + 1;
    vOut[uVar6].id = vIn[1].id;
    uVar4 = *(undefined8 *)(vIn[1].v.m_floats + 2);
    *(undefined8 *)vOut[uVar6].v.m_floats = *(undefined8 *)vIn[1].v.m_floats;
    *(undefined8 *)(vOut[uVar6].v.m_floats + 2) = uVar4;
  }
  uVar6 = uVar5;
  if (fVar3 * fVar8 < 0.0) {
    fVar1 = (vIn->v).m_floats[2];
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *(ulong *)vIn[1].v.m_floats;
    uVar2 = *(ulong *)(vIn->v).m_floats;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar2;
    fVar8 = fVar3 / (fVar3 - fVar8);
    piVar7 = &vIn->id;
    if (fVar3 <= 0.0) {
      piVar7 = &vIn[1].id;
    }
    uVar6 = uVar5 + 1;
    auVar10 = vsubps_avx(auVar10,auVar11);
    auVar9._0_4_ = (float)uVar2 + fVar8 * auVar10._0_4_;
    auVar9._4_4_ = (float)(uVar2 >> 0x20) + fVar8 * auVar10._4_4_;
    auVar9._8_4_ = fVar8 * auVar10._8_4_ + 0.0;
    auVar9._12_4_ = fVar8 * auVar10._12_4_ + 0.0;
    auVar10 = vinsertps_avx(auVar9,ZEXT416((uint)(fVar1 + fVar8 * (vIn[1].v.m_floats[2] - fVar1))),
                            0x28);
    *(undefined1 (*) [16])vOut[uVar5].v.m_floats = auVar10;
    vOut[uVar5].id = *piVar7;
  }
  return uVar6;
}

Assistant:

SIMD_FORCE_INLINE cbtScalar dot(const cbtVector3& v) const
	{
#if defined BT_USE_SIMD_VECTOR3 && defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE)
		__m128 vd = _mm_mul_ps(mVec128, v.mVec128);
		__m128 z = _mm_movehl_ps(vd, vd);
		__m128 y = _mm_shuffle_ps(vd, vd, 0x55);
		vd = _mm_add_ss(vd, y);
		vd = _mm_add_ss(vd, z);
		return _mm_cvtss_f32(vd);
#elif defined(BT_USE_NEON)
		float32x4_t vd = vmulq_f32(mVec128, v.mVec128);
		float32x2_t x = vpadd_f32(vget_low_f32(vd), vget_low_f32(vd));
		x = vadd_f32(x, vget_high_f32(vd));
		return vget_lane_f32(x, 0);
#else
		return m_floats[0] * v.m_floats[0] +
			   m_floats[1] * v.m_floats[1] +
			   m_floats[2] * v.m_floats[2];
#endif
	}